

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexelFetch2DArray(ShaderEvalContext *c,TexLookupParams *p)

{
  int i;
  long lVar1;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  
  tcu::ConstPixelBufferAccess::getPixel
            ((ConstPixelBufferAccess *)&stack0xffffffffffffffe0,
             (int)c->in[1].m_data[0] * 0x28 +
             (int)((c->textures[0].tex2DArray)->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start,
             (int)c->in[0].m_data[0] + (p->offset).m_data[0],
             (int)c->in[0].m_data[1] + (p->offset).m_data[1]);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar1 = 0;
  do {
    local_48[lVar1] = *(float *)(&stack0xffffffffffffffe0 + lVar1 * 4) * (p->scale).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_38 + lVar1 * 4) = local_48[lVar1] + (p->bias).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void evalTexelFetch2DArray (ShaderEvalContext& c, const TexLookupParams& p)
{
	int	x	= deChopFloatToInt32(c.in[0].x())+p.offset.x();
	int	y	= deChopFloatToInt32(c.in[0].y())+p.offset.y();
	int	l	= deChopFloatToInt32(c.in[0].z());
	int	lod = deChopFloatToInt32(c.in[1].x());
	c.color = c.textures[0].tex2DArray->getLevel(lod).getPixel(x, y, l)*p.scale + p.bias;
}